

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O0

bool check_qclab_qgates_RotationY<std::complex<float>>
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *v1,
               vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *v2)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference __x;
  const_reference __y;
  float fVar4;
  complex<float> local_38;
  ulong local_30;
  size_t i;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *pvStack_20;
  R tol;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *v2_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *v1_local;
  
  pvStack_20 = v2;
  v2_local = v1;
  fVar4 = std::numeric_limits<float>::epsilon();
  i._4_4_ = fVar4 * 100.0;
  sVar2 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size(v2_local);
  sVar3 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size(pvStack_20);
  if (sVar2 != sVar3) {
    __assert_fail("v1.size() == v2.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationY.cpp"
                  ,0xb,
                  "bool check_qclab_qgates_RotationY(const std::vector<T> &, const std::vector<T> &) [T = std::complex<float>]"
                 );
  }
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    sVar2 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size(v2_local);
    if (sVar2 <= uVar1) {
      return true;
    }
    __x = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator[]
                    (v2_local,local_30);
    __y = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator[]
                    (pvStack_20,local_30);
    std::operator-(__x,__y);
    fVar4 = std::abs<float>(&local_38);
    if (1.1920929e-05 < fVar4) break;
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool check_qclab_qgates_RotationY( const std::vector< T >& v1 ,
                                   const std::vector< T >& v2 ) {

  using R = qclab::real_t< T > ;
  const R tol = 100 * std::numeric_limits< R >::epsilon() ;

  assert( v1.size() == v2.size() ) ;
  for ( size_t i = 0; i < v1.size(); ++i ) {
    if ( std::abs( v1[i] - v2[i] ) > tol ) return false ;
  }
  return true ;

}